

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableKernel.cpp
# Opt level: O0

void Ptex::v2_2::(anonymous_namespace)::ApplyS<Ptex::v2_2::PtexHalf,4>
               (PtexSeparableKernel *k,float *result,void *data,int param_4,int nTxChan)

{
  int iVar1;
  PtexHalf *in_RDX;
  Res *in_RDI;
  int in_R8D;
  PtexHalf *pRowEnd;
  float *kup;
  PtexHalf *pEnd;
  PtexHalf *p;
  float *kvp;
  int rowskip;
  int datalen;
  int rowlen;
  float *rowResult;
  float weight;
  PtexHalf *val;
  float *in_stack_ffffffffffffff88;
  VecMult<Ptex::v2_2::PtexHalf,_4> *in_stack_ffffffffffffff90;
  VecAccum<float,_4> local_63;
  VecAccum<Ptex::v2_2::PtexHalf,_4> local_62;
  VecMult<Ptex::v2_2::PtexHalf,_4> local_61;
  PtexHalf *local_60;
  long local_58;
  PtexHalf *local_50;
  PtexHalf *local_48;
  long local_40;
  int local_34;
  int local_30;
  int local_2c;
  undefined1 *local_28;
  int local_20;
  PtexHalf *local_18;
  Res *local_8;
  
  local_28 = &stack0xffffffffffffff88;
  local_20 = in_R8D;
  local_18 = in_RDX;
  local_8 = in_RDI;
  local_2c = Res::u(in_RDI);
  local_2c = local_2c * local_20;
  local_30 = *(int *)(local_8 + 6) * local_20;
  local_34 = local_2c - local_30;
  local_40 = *(long *)(local_8 + 0x10);
  weight = *(float *)(local_8 + 4);
  iVar1 = Res::u(local_8);
  local_48 = local_18 + ((int)weight * iVar1 + *(int *)(local_8 + 2)) * local_20;
  local_50 = local_48 + *(int *)(local_8 + 8) * local_2c;
  val = local_18;
  for (; local_48 != local_50; local_48 = local_48 + local_34) {
    local_58 = *(long *)(local_8 + 0xc);
    local_60 = local_48 + local_30;
    PtexUtils::VecMult<Ptex::v2_2::PtexHalf,_4>::VecMult(&local_61);
    local_58 = local_58 + 4;
    PtexUtils::VecMult<Ptex::v2_2::PtexHalf,_4>::operator()
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,val,weight);
    for (local_48 = local_48 + local_20; local_48 != local_60; local_48 = local_48 + local_20) {
      PtexUtils::VecAccum<Ptex::v2_2::PtexHalf,_4>::VecAccum(&local_62);
      local_58 = local_58 + 4;
      PtexUtils::VecAccum<Ptex::v2_2::PtexHalf,_4>::operator()
                ((VecAccum<Ptex::v2_2::PtexHalf,_4> *)in_stack_ffffffffffffff90,
                 in_stack_ffffffffffffff88,val,weight);
    }
    PtexUtils::VecAccum<float,_4>::VecAccum(&local_63);
    local_40 = local_40 + 4;
    PtexUtils::VecAccum<float,_4>::operator()
              ((VecAccum<float,_4> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
               (float *)val,weight);
  }
  return;
}

Assistant:

void ApplyS(PtexSeparableKernel& k, float* result, void* data, int /*nChan*/, int nTxChan)
    {
        float* rowResult = (float*) alloca(nChan*sizeof(float));
        int rowlen = k.res.u() * nTxChan;
        int datalen = k.uw * nTxChan;
        int rowskip = rowlen - datalen;
        float* kvp = k.kv;
        T* p = static_cast<T*>(data) + (k.v * k.res.u() + k.u) * nTxChan;
        T* pEnd = p + k.vw * rowlen;
        while (p != pEnd)
        {
            float* kup = k.ku;
            T* pRowEnd = p + datalen;
            // just mult and copy first element
            PtexUtils::VecMult<T,nChan>()(rowResult, p, *kup++);
            p += nTxChan;
            // accumulate remaining elements
            while (p != pRowEnd) {
                // rowResult[i] = p[i] * ku[u] for i in {0..n-1}
                PtexUtils::VecAccum<T,nChan>()(rowResult, p, *kup++);
                p += nTxChan;
            }
            // result[i] += rowResult[i] * kv[v] for i in {0..n-1}
            PtexUtils::VecAccum<float,nChan>()(result, rowResult, *kvp++);
            p += rowskip;
        }
    }